

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_decoding_transform.h
# Opt level: O2

bool __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::DecodeTransformData
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,
          DecoderBuffer *buffer)

{
  bool bVar1;
  int in_EAX;
  int max_quantized_value;
  int center_value;
  int local_18;
  int local_14;
  
  local_18 = in_EAX;
  bVar1 = DecoderBuffer::Decode<int>(buffer,&local_18);
  if (((bVar1) && (bVar1 = DecoderBuffer::Decode<int>(buffer,&local_14), bVar1)) &&
     (bVar1 = PredictionSchemeNormalOctahedronTransformBase<int>::set_max_quantized_value
                        ((PredictionSchemeNormalOctahedronTransformBase<int> *)this,local_18), bVar1
     )) {
    return (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
           super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
           quantization_bits_ - 2U < 0x1d;
  }
  return false;
}

Assistant:

bool DecodeTransformData(DecoderBuffer *buffer) {
    DataTypeT max_quantized_value, center_value;
    if (!buffer->Decode(&max_quantized_value)) {
      return false;
    }
    if (!buffer->Decode(&center_value)) {
      return false;
    }
    (void)center_value;
    if (!this->set_max_quantized_value(max_quantized_value)) {
      return false;
    }
    // Account for reading wrong values, e.g., due to fuzzing.
    if (this->quantization_bits() < 2) {
      return false;
    }
    if (this->quantization_bits() > 30) {
      return false;
    }
    return true;
  }